

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::reserve(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,size_t c)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong numBuckets;
  ulong uVar3;
  
  if (c < this->mNumElements) {
    c = this->mNumElements;
  }
  uVar2 = 8;
  do {
    numBuckets = uVar2;
    if (numBuckets < 0x28f5c28f5c28f5d) {
      uVar3 = (numBuckets * 0x50) / 100;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = numBuckets >> 2;
      uVar3 = (SUB168(auVar1 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0x3ffffffffffffffc) * 0x14;
    }
  } while ((numBuckets != 0) && (uVar2 = numBuckets * 2, uVar3 < c));
  if (numBuckets == 0) {
    throwOverflowError(this);
    numBuckets = 0;
  }
  rehashPowerOfTwo(this,numBuckets);
  return;
}

Assistant:

void reserve(size_t c) {
        ROBIN_HOOD_TRACE(this)
        auto const minElementsAllowed = (std::max)(c, mNumElements);
        auto newSize = InitialNumElements;
        while (calcMaxNumElementsAllowed(newSize) < minElementsAllowed && newSize != 0) {
            newSize *= 2;
        }
        if (ROBIN_HOOD_UNLIKELY(newSize == 0)) {
            throwOverflowError();
        }

        rehashPowerOfTwo(newSize);
    }